

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderStatus.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderStatus::Mode5TransponderStatus
          (Mode5TransponderStatus *this,Mode5Reply R,KBOOL LineTest,AntennaSelection AS,KBOOL Crypto
          ,KBOOL LocationIncluded,KBOOL LocationErrorIncluded,PlatformType PT,KBOOL Lvl2Included,
          KBOOL Status,KBOOL Dmg,KBOOL Malfnc)

{
  undefined7 in_register_00000011;
  undefined3 in_register_00000081;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5TransponderStatus_00226be0;
  (this->m_StatusUnion).m_ui16Status =
       (ushort)Malfnc << 0xf | (ushort)Dmg << 0xe | (ushort)Status << 0xd |
       (ushort)Lvl2Included << 0xb | (ushort)((PT & AirPlatformType) << 10) |
       (ushort)LocationErrorIncluded << 9 |
       (ushort)LocationIncluded << 8 |
       (short)CONCAT31(in_register_00000081,Crypto) << 7 |
       (ushort)((int)CONCAT71(in_register_00000011,LineTest) << 4) | (ushort)R & 0xf |
       (ushort)((AS & Diversity) << 5);
  return;
}

Assistant:

Mode5TransponderStatus::Mode5TransponderStatus( KDIS::DATA_TYPE::ENUMS::Mode5Reply R, KBOOL LineTest, KDIS::DATA_TYPE::ENUMS::AntennaSelection AS, KBOOL Crypto,
	                                            KBOOL LocationIncluded, KBOOL LocationErrorIncluded, KDIS::DATA_TYPE::ENUMS::PlatformType PT, KBOOL Lvl2Included,
                                                KBOOL Status, KBOOL Dmg, KBOOL Malfnc )
{	
	m_StatusUnion.m_ui16Reply = R;
	m_StatusUnion.m_ui16LineTst = LineTest;      
	m_StatusUnion.m_ui16AntennaSel = AS;
	m_StatusUnion.m_ui16CryptoCtrl = Crypto; 
	m_StatusUnion.m_ui16LatLonAltSrc = LocationIncluded;
	m_StatusUnion.m_ui16LocErrs = LocationErrorIncluded;
	m_StatusUnion.m_ui16PlatfrmTyp = PT;
	m_StatusUnion.m_ui16LvlSel = Lvl2Included;
	m_StatusUnion.m_ui16Padding = 0;
	m_StatusUnion.m_ui16OnOff = Status;
	m_StatusUnion.m_ui16Dmg = Dmg;          
	m_StatusUnion.m_ui16MalFnc = Malfnc;   	
}